

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void define_gf_group(AV1_COMP *cpi,EncodeFrameParams *frame_params,int is_final_pass)

{
  int *piVar1;
  PRIMARY_RATE_CONTROL *p_rc;
  TWO_PASS *twopass;
  FRAME_INFO *frame_info;
  FRAME_UPDATE_TYPE FVar2;
  byte bVar3;
  uint uVar4;
  AV1_PRIMARY *pAVar5;
  FIRSTPASS_STATS *start_pos;
  FIRSTPASS_STATS *pFVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  AV1_PRIMARY *pAVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  undefined4 uVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  int local_234;
  int i;
  double local_228;
  RATE_CONTROL *local_220;
  TWO_PASS_FRAME *local_218;
  GF_GROUP *local_210;
  int *local_208;
  int *local_200;
  FRAME_INFO *local_1f8;
  EncodeFrameParams *local_1f0;
  uint auStack_1e8 [8];
  int layer_frames [7];
  GF_GROUP_STATS local_1a8;
  FIRSTPASS_STATS next_frame;
  
  local_228 = (double)CONCAT44(local_228._4_4_,is_final_pass);
  pAVar5 = cpi->ppi;
  start_pos = (cpi->twopass_frame).stats_in;
  local_210 = &pAVar5->gf_group;
  local_220 = (RATE_CONTROL *)CONCAT44(local_220._4_4_,(cpi->common).width);
  bVar19 = (cpi->rc).frames_since_key == 0;
  iVar7 = (cpi->common).height;
  pAVar5->internal_altref_allowed = (uint)(1 < (cpi->oxcf).gf_cfg.gf_max_pyr_height);
  pAVar12 = pAVar5;
  local_1f0 = frame_params;
  if (!bVar19) {
    memset(local_210,0,0x58f4);
    cpi->gf_frame_index = '\0';
    pAVar12 = cpi->ppi;
  }
  if ((cpi->oxcf).pass == AOM_RC_ONE_PASS) {
    if (pAVar12->lap_enabled == 0) {
      if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
        av1_cyclic_refresh_set_golden_update(cpi);
      }
      else {
        iVar7 = (pAVar12->p_rc).cur_gf_index;
        (pAVar12->p_rc).baseline_gf_interval = (pAVar12->p_rc).gf_intervals[iVar7];
        piVar1 = &(cpi->rc).intervals_till_gf_calculate_due;
        *piVar1 = *piVar1 + -1;
        (pAVar12->p_rc).cur_gf_index = iVar7 + 1;
      }
      correct_frames_to_key(cpi);
      iVar7 = (pAVar12->p_rc).baseline_gf_interval;
      iVar14 = (cpi->rc).frames_to_key;
      if (iVar14 < iVar7) {
        (pAVar12->p_rc).baseline_gf_interval = iVar14;
        iVar7 = iVar14;
      }
      (pAVar12->p_rc).gfu_boost = 2000;
      (pAVar12->p_rc).constrained_gf_group = (uint)(iVar14 <= iVar7);
      (pAVar12->gf_group).max_layer_depth_allowed = (cpi->oxcf).gf_cfg.gf_max_pyr_height;
      iVar14 = (cpi->oxcf).gf_cfg.lag_in_frames;
      if ((((iVar14 < iVar7) || (iVar14 < 3)) || ((cpi->oxcf).gf_cfg.enable_auto_arf == false)) ||
         (iVar7 < (cpi->rc).min_gf_interval)) {
        (pAVar12->gf_group).max_layer_depth_allowed = 0;
      }
      av1_gop_setup_structure(cpi);
      if ((pAVar12->gf_group).size < 1) {
        return;
      }
      lVar10 = 0;
      do {
        FVar2 = (pAVar12->gf_group).update_type[lVar10];
        if ((cpi->oxcf).rc_cfg.mode == AOM_CBR) {
          if (FVar2 == '\0') {
            iVar7 = av1_calc_iframe_target_size_one_pass_cbr(cpi);
          }
          else {
            iVar7 = av1_calc_pframe_target_size_one_pass_cbr(cpi,FVar2);
          }
        }
        else if (FVar2 == '\0') {
          iVar7 = av1_calc_iframe_target_size_one_pass_vbr(cpi);
        }
        else {
          iVar7 = av1_calc_pframe_target_size_one_pass_vbr(cpi,FVar2);
        }
        (pAVar12->gf_group).bit_allocation[lVar10] = iVar7;
        lVar10 = lVar10 + 1;
      } while (lVar10 < (pAVar12->gf_group).size);
      return;
    }
LAB_00a5ed30:
    correct_frames_to_key(cpi);
  }
  else if (pAVar12->lap_enabled != 0) goto LAB_00a5ed30;
  uVar13 = (uint)bVar19;
  accumulate_gop_stats(cpi,uVar13,(int)local_220,iVar7,&next_frame,start_pos,&local_1a8,&i);
  iVar14 = (cpi->oxcf).gf_cfg.gf_min_pyr_height;
  iVar8 = (cpi->rc).min_gf_interval;
  if (((iVar14 < 2) && (0.95 < local_1a8.zero_motion_accumulator)) &&
     ((local_1a8.avg_sr_coded_error < 40.0 && (local_1a8.avg_raw_err_stdev < 2000.0)))) {
    cpi->ppi->internal_altref_allowed = 0;
  }
  if (iVar14 == 0) {
    if (cpi->ppi->lap_enabled == 0) {
      if ((local_1a8.zero_motion_accumulator < 0.995) || ((pAVar5->twopass).kf_zeromotion_pct < 99))
      goto LAB_00a5ee68;
    }
    else if (local_1a8.zero_motion_accumulator < 0.999) {
LAB_00a5ee68:
      bVar19 = true;
      if ((pAVar5->p_rc).use_arf_in_this_kf_group != 0) {
        iVar14 = 0;
        bVar3 = 0;
        local_234 = 0;
        if (i < (cpi->oxcf).gf_cfg.lag_in_frames && 3 < i) goto LAB_00a5eea1;
        goto LAB_00a5eec7;
      }
    }
LAB_00a5eebd:
    bVar19 = true;
    iVar14 = 0;
    bVar3 = 0;
    local_234 = 0;
  }
  else {
    bVar19 = true;
    if ((pAVar5->p_rc).use_arf_in_this_kf_group == 0) goto LAB_00a5eebd;
    iVar14 = 0;
    bVar3 = 0;
    local_234 = 0;
    if (2 < i && i < (cpi->oxcf).gf_cfg.lag_in_frames) {
LAB_00a5eea1:
      iVar14 = (cpi->oxcf).gf_cfg.gf_max_pyr_height;
      local_234 = 1;
      bVar3 = 1;
      bVar19 = false;
    }
  }
LAB_00a5eec7:
  (pAVar5->gf_group).max_layer_depth_allowed = iVar14;
  if ((((cpi->oxcf).rc_cfg.mode == AOM_Q) && ((cpi->oxcf).rc_cfg.cq_level < 0x81)) ||
     (cpi->ppi->internal_altref_allowed == 0)) {
    bVar20 = true;
    if ((cpi->oxcf).rc_cfg.best_allowed_q == 0) {
      bVar20 = (cpi->oxcf).rc_cfg.worst_allowed_q != 0;
    }
    if (!(bool)(bVar3 & bVar20)) goto LAB_00a5ef4b;
    iVar14 = (cpi->rc).frames_to_key - i;
    uVar17 = 0;
    bVar20 = false;
    if (9 < i) {
      if (iVar14 < 8) {
        bVar20 = iVar8 <= iVar14 + 1;
      }
      else {
        bVar20 = false;
      }
    }
    if ((bool)(iVar8 + 1 < i & ((4 < i && iVar14 == 0) | bVar20))) {
      i = i + -1;
      if (local_228._0_4_ != 0) {
        (cpi->rc).intervals_till_gf_calculate_due = 0;
      }
      piVar1 = (pAVar5->p_rc).gf_intervals + (pAVar5->p_rc).cur_gf_index;
      *piVar1 = *piVar1 + -1;
      (cpi->twopass_frame).stats_in = start_pos;
      accumulate_gop_stats(cpi,uVar13,(int)local_220,iVar7,&next_frame,start_pos,&local_1a8,&i);
      uVar17 = 0xffffffff;
    }
  }
  else {
LAB_00a5ef4b:
    uVar17 = 0;
  }
  iVar7 = i;
  local_220 = (RATE_CONTROL *)CONCAT44(local_220._4_4_,uVar17);
  if (local_228._0_4_ != 0) {
    piVar1 = &(cpi->rc).intervals_till_gf_calculate_due;
    *piVar1 = *piVar1 + -1;
    piVar1 = &(pAVar5->p_rc).cur_gf_index;
    *piVar1 = *piVar1 + 1;
  }
  local_218 = &cpi->twopass_frame;
  (pAVar5->p_rc).constrained_gf_group = (uint)((cpi->rc).frames_to_key <= i);
  (pAVar5->p_rc).baseline_gf_interval = i;
  (cpi->rc).frames_till_gf_update_due = i;
  av1_gop_setup_structure(cpi);
  pAVar5 = cpi->ppi;
  p_rc = &pAVar5->p_rc;
  twopass = &pAVar5->twopass;
  frame_info = &cpi->frame_info;
  iVar14 = iVar7 - uVar13;
  if (bVar19) {
    local_218->stats_in = start_pos;
    local_200 = &(pAVar5->p_rc).num_stats_used_for_gfu_boost;
    local_208 = &(pAVar5->p_rc).num_stats_required_for_gfu_boost;
    local_1f8 = frame_info;
    iVar7 = av1_calc_arf_boost(twopass,local_218,p_rc,frame_info,(int)local_220,iVar14,0,local_200,
                               local_208,pAVar5->lap_enabled);
    iVar8 = 0x1518;
    if (iVar7 < 0x1519) {
      iVar8 = av1_calc_arf_boost(twopass,local_218,p_rc,local_1f8,(int)local_220,iVar14,0,local_200,
                                 local_208,cpi->ppi->lap_enabled);
    }
    (pAVar5->p_rc).gfu_boost = iVar8;
    (pAVar5->p_rc).arf_boost_factor = 1.0;
  }
  else {
    iVar7 = (cpi->rc).frames_to_key - iVar7;
    iVar8 = 0;
    if (0 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar14 <= iVar7) {
      iVar8 = iVar14;
    }
    iVar7 = av1_calc_arf_boost(twopass,local_218,p_rc,frame_info,(int)local_220,iVar8,iVar14,
                               &(pAVar5->p_rc).num_stats_used_for_gfu_boost,
                               &(pAVar5->p_rc).num_stats_required_for_gfu_boost,pAVar5->lap_enabled)
    ;
    (pAVar5->p_rc).gfu_boost = iVar7;
    (pAVar5->p_rc).arf_boost_factor = 1.0;
    if ((((cpi->oxcf).rc_cfg.best_allowed_q != 0) || ((cpi->oxcf).rc_cfg.worst_allowed_q != 0)) &&
       ((uint)((cpi->rc).frames_to_key - iVar14) < 2)) {
      (pAVar5->p_rc).arf_boost_factor = 0.2;
    }
  }
  (cpi->twopass_frame).stats_in = start_pos;
  pAVar12 = cpi->ppi;
  if (pAVar12->lap_enabled != 0) {
    local_1a8.gf_group_err = (double)(pAVar5->p_rc).baseline_gf_interval;
  }
  lVar10 = (long)(cpi->rc).avg_frame_bandwidth * (long)(cpi->oxcf).rc_cfg.vbrmax_section;
  if (lVar10 < -99) {
    lVar10 = 0;
  }
  else {
    lVar10 = lVar10 / 100;
    lVar9 = (long)(cpi->rc).max_frame_bandwidth;
    if (lVar9 <= lVar10) {
      lVar10 = lVar9;
    }
  }
  lVar9 = (pAVar12->twopass).kf_group_bits;
  if ((lVar9 < 1) || (dVar21 = (pAVar12->twopass).kf_group_error_left, dVar21 <= 0.0)) {
    lVar11 = 0;
LAB_00a5f1cd:
    if (lVar11 < lVar9) {
      lVar9 = lVar11;
    }
  }
  else {
    lVar11 = (long)((local_1a8.gf_group_err / dVar21) * (double)lVar9);
    if (-1 < lVar11) goto LAB_00a5f1cd;
    lVar9 = 0;
  }
  lVar10 = lVar10 * (pAVar12->p_rc).baseline_gf_interval;
  if (lVar9 < lVar10) {
    lVar10 = lVar9;
  }
  p_rc->gf_group_bits = lVar10;
  if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
LAB_00a5f28d:
    if (local_228._0_4_ != 0) goto LAB_00a5f294;
    local_228 = (double)CONCAT44(local_228._4_4_,(int)CONCAT71((int7)((ulong)lVar9 >> 8),1));
  }
  else {
    iVar7 = (pAVar5->p_rc).baseline_gf_interval;
    lVar11 = (long)iVar7;
    lVar9 = CONCAT71((int7)((ulong)lVar9 >> 8),lVar11 < 2);
    if (local_228._0_4_ == 0 || lVar11 < 2) goto LAB_00a5f28d;
    dVar21 = (double)iVar7;
    local_228 = local_1a8.gf_group_err;
    iVar14 = get_twopass_worst_quality
                       (cpi,local_1a8.gf_group_raw_error / dVar21,
                        (local_1a8.gf_group_inactive_zone_rows +
                        local_1a8.gf_group_inactive_zone_rows) /
                        ((double)(cpi->common).mi_params.mb_rows * dVar21) +
                        local_1a8.gf_group_skip_pct / dVar21,(int)(lVar10 / lVar11));
    iVar7 = (cpi->rc).active_worst_quality >> 1;
    if (iVar7 < iVar14) {
      iVar7 = iVar14;
    }
    (cpi->rc).active_worst_quality = iVar7;
    local_1a8.gf_group_err = local_228;
LAB_00a5f294:
    (pAVar5->twopass).kf_group_error_left =
         (pAVar5->twopass).kf_group_error_left - local_1a8.gf_group_err;
    local_228 = (double)((ulong)local_228 & 0xffffffff00000000);
  }
  local_220 = &cpi->rc;
  (cpi->twopass_frame).stats_in = start_pos;
  iVar7 = (cpi->rc).frames_since_key;
  if (iVar7 != 0) {
    pFVar6 = ((pAVar5->twopass).stats_buf_ctx)->stats_in_end;
    iVar14 = (pAVar5->p_rc).baseline_gf_interval;
    dVar22 = 0.0;
    dVar21 = 0.0;
    if (0 < iVar14 && start_pos < pFVar6) {
      iVar8 = 1;
      do {
        dVar22 = dVar22 + start_pos->intra_error;
        dVar21 = dVar21 + start_pos->coded_error;
        if (pFVar6 <= start_pos + 1) break;
        bVar20 = iVar8 < iVar14;
        iVar8 = iVar8 + 1;
        start_pos = start_pos + 1;
      } while (bVar20);
    }
    twopass->section_intra_rating =
         (int)(dVar22 / (dVar21 + *(double *)(&DAT_00d64a80 + (ulong)(dVar21 < 0.0) * 8)));
  }
  lVar10 = (pAVar5->p_rc).gf_group_bits;
  pAVar12 = cpi->ppi;
  uVar18 = (uint)(iVar7 == 0);
  iVar14 = calculate_boost_bits
                     ((pAVar12->p_rc).baseline_gf_interval - uVar18,(pAVar12->p_rc).gfu_boost,lVar10
                     );
  iVar14 = adjust_boost_bits_for_target_level(cpi,local_220,iVar14,lVar10,1);
  uVar13 = (pAVar5->gf_group).size;
  layer_frames[4] = 0;
  layer_frames[5] = 0;
  layer_frames[6] = 0;
  layer_frames[0] = 0;
  layer_frames[1] = 0;
  layer_frames[2] = 0;
  layer_frames[3] = 0;
  lVar9 = 0;
  if (!bVar19) {
    lVar9 = (long)iVar14;
  }
  uVar15 = (pAVar12->p_rc).baseline_gf_interval - (uint)((cpi->rc).frames_since_key == 0);
  if ((int)uVar15 < 2) {
    uVar15 = 1;
  }
  uVar4 = (pAVar5->gf_group).max_layer_depth;
  if ((int)uVar18 < (int)uVar13) {
    uVar16 = (ulong)(iVar7 == 0);
    do {
      FVar2 = (pAVar5->gf_group).update_type[uVar16];
      if ((FVar2 == '\x06') || (FVar2 == '\x03')) {
        layer_frames[(pAVar5->gf_group).layer_depth[uVar16]] =
             layer_frames[(pAVar5->gf_group).layer_depth[uVar16]] + 1;
      }
      uVar16 = uVar16 + 1;
    } while (uVar13 != uVar16);
  }
  auStack_1e8[4] = 0;
  auStack_1e8[5] = 0;
  auStack_1e8[6] = 0;
  auStack_1e8[0] = 0;
  auStack_1e8[1] = 0;
  auStack_1e8[2] = 0;
  auStack_1e8[3] = 0;
  if (1 < (int)uVar4) {
    lVar11 = 0;
    do {
      dVar21 = 1.0;
      if ((ulong)(uVar4 - 1) * 4 + -4 != lVar11) {
        dVar21 = *(double *)(allocate_gf_group_bits_layer_fraction + lVar11 * 2 + 8);
      }
      iVar8 = *(int *)((long)layer_frames + lVar11 + 4);
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      *(int *)((long)auStack_1e8 + lVar11 + 4) = (int)(((double)iVar14 * dVar21) / (double)iVar8);
      iVar14 = iVar14 - (int)((double)iVar14 * dVar21);
      lVar11 = lVar11 + 4;
    } while ((ulong)uVar4 * 4 + -4 != lVar11);
  }
  if ((int)uVar18 < (int)uVar13) {
    uVar16 = (ulong)(iVar7 == 0);
    do {
      bVar3 = (pAVar5->gf_group).update_type[uVar16];
      iVar7 = 0;
      if ((1 < bVar3 - 4) &&
         ((iVar7 = (int)((lVar10 - lVar9) / (long)(ulong)uVar15), bVar3 == 6 || (bVar3 == 3)))) {
        bVar19 = (int)(auStack_1e8[(pAVar5->gf_group).layer_depth[uVar16]] ^ 0x7fffffff) < iVar7;
        iVar7 = auStack_1e8[(pAVar5->gf_group).layer_depth[uVar16]] + iVar7;
        if (bVar19) {
          iVar7 = 0x7fffffff;
        }
      }
      (pAVar5->gf_group).bit_allocation[uVar16] = iVar7;
      uVar16 = uVar16 + 1;
    } while (uVar13 != uVar16);
    if (0xf9 < (int)uVar13) goto LAB_00a5f53c;
  }
  (pAVar5->gf_group).bit_allocation[(int)uVar13] = 0;
LAB_00a5f53c:
  if (local_228._0_1_ == '\0') {
    (cpi->ppi->gf_state).arf_gf_boost_lst = local_234;
    (pAVar5->twopass).rolling_arf_group_target_bits = 1;
    (pAVar5->twopass).rolling_arf_group_actual_bits = 1;
  }
  local_1f0->frame_type = (cpi->rc).frames_since_key != 0;
  local_1f0->show_frame =
       (uint)(local_210->update_type[cpi->gf_frame_index] != '\x06' &&
             local_210->update_type[cpi->gf_frame_index] != '\x03');
  return;
}

Assistant:

static void define_gf_group(AV1_COMP *cpi, EncodeFrameParams *frame_params,
                            int is_final_pass) {
  AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS next_frame;
  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const GFConfig *const gf_cfg = &oxcf->gf_cfg;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  const int f_w = cm->width;
  const int f_h = cm->height;
  int i;
  const int is_intra_only = rc->frames_since_key == 0;

  cpi->ppi->internal_altref_allowed = (gf_cfg->gf_max_pyr_height > 1);

  // Reset the GF group data structures unless this is a key
  // frame in which case it will already have been done.
  if (!is_intra_only) {
    av1_zero(cpi->ppi->gf_group);
    cpi->gf_frame_index = 0;
  }

  if (has_no_stats_stage(cpi)) {
    define_gf_group_pass0(cpi);
    return;
  }

#if CONFIG_THREE_PASS
  if (cpi->third_pass_ctx && oxcf->pass == AOM_RC_THIRD_PASS) {
    int ret = define_gf_group_pass3(cpi, frame_params, is_final_pass);
    if (ret == 0) return;

    av1_free_thirdpass_ctx(cpi->third_pass_ctx);
    cpi->third_pass_ctx = NULL;
  }
#endif  // CONFIG_THREE_PASS

  // correct frames_to_key when lookahead queue is emptying
  if (cpi->ppi->lap_enabled) {
    correct_frames_to_key(cpi);
  }

  GF_GROUP_STATS gf_stats;
  accumulate_gop_stats(cpi, is_intra_only, f_w, f_h, &next_frame, start_pos,
                       &gf_stats, &i);

  const int can_disable_arf = !gf_cfg->gf_min_pyr_height;

  // If this is a key frame or the overlay from a previous arf then
  // the error score / cost of this frame has already been accounted for.
  const int active_min_gf_interval = rc->min_gf_interval;

  // Disable internal ARFs for "still" gf groups.
  //   zero_motion_accumulator: minimum percentage of (0,0) motion;
  //   avg_sr_coded_error:      average of the SSE per pixel of each frame;
  //   avg_raw_err_stdev:       average of the standard deviation of (0,0)
  //                            motion error per block of each frame.
  const int can_disable_internal_arfs = gf_cfg->gf_min_pyr_height <= 1;
  if (can_disable_internal_arfs &&
      gf_stats.zero_motion_accumulator > MIN_ZERO_MOTION &&
      gf_stats.avg_sr_coded_error < MAX_SR_CODED_ERROR &&
      gf_stats.avg_raw_err_stdev < MAX_RAW_ERR_VAR) {
    cpi->ppi->internal_altref_allowed = 0;
  }

  int use_alt_ref;
  if (can_disable_arf) {
    use_alt_ref =
        !is_almost_static(gf_stats.zero_motion_accumulator,
                          twopass->kf_zeromotion_pct, cpi->ppi->lap_enabled) &&
        p_rc->use_arf_in_this_kf_group && (i < gf_cfg->lag_in_frames) &&
        (i >= MIN_GF_INTERVAL);
  } else {
    use_alt_ref = p_rc->use_arf_in_this_kf_group &&
                  (i < gf_cfg->lag_in_frames) && (i > 2);
  }
  if (use_alt_ref) {
    gf_group->max_layer_depth_allowed = gf_cfg->gf_max_pyr_height;
  } else {
    gf_group->max_layer_depth_allowed = 0;
  }

  int alt_offset = 0;
  // The length reduction strategy is tweaked for certain cases, and doesn't
  // work well for certain other cases.
  const int allow_gf_length_reduction =
      ((rc_cfg->mode == AOM_Q && rc_cfg->cq_level <= 128) ||
       !cpi->ppi->internal_altref_allowed) &&
      !is_lossless_requested(rc_cfg);

  if (allow_gf_length_reduction && use_alt_ref) {
    // adjust length of this gf group if one of the following condition met
    // 1: only one overlay frame left and this gf is too long
    // 2: next gf group is too short to have arf compared to the current gf

    // maximum length of next gf group
    const int next_gf_len = rc->frames_to_key - i;
    const int single_overlay_left =
        next_gf_len == 0 && i > REDUCE_GF_LENGTH_THRESH;
    // the next gf is probably going to have a ARF but it will be shorter than
    // this gf
    const int unbalanced_gf =
        i > REDUCE_GF_LENGTH_TO_KEY_THRESH &&
        next_gf_len + 1 < REDUCE_GF_LENGTH_TO_KEY_THRESH &&
        next_gf_len + 1 >= rc->min_gf_interval;

    if (single_overlay_left || unbalanced_gf) {
      const int roll_back = REDUCE_GF_LENGTH_BY;
      // Reduce length only if active_min_gf_interval will be respected later.
      if (i - roll_back >= active_min_gf_interval + 1) {
        alt_offset = -roll_back;
        i -= roll_back;
        if (is_final_pass) rc->intervals_till_gf_calculate_due = 0;
        p_rc->gf_intervals[p_rc->cur_gf_index] -= roll_back;
        reset_fpf_position(&cpi->twopass_frame, start_pos);
        accumulate_gop_stats(cpi, is_intra_only, f_w, f_h, &next_frame,
                             start_pos, &gf_stats, &i);
      }
    }
  }

  update_gop_length(rc, p_rc, i, is_final_pass);

  // Set up the structure of this Group-Of-Pictures (same as GF_GROUP)
  av1_gop_setup_structure(cpi);

  set_gop_bits_boost(cpi, i, is_intra_only, is_final_pass, use_alt_ref,
                     alt_offset, start_pos, &gf_stats);

  frame_params->frame_type =
      rc->frames_since_key == 0 ? KEY_FRAME : INTER_FRAME;
  frame_params->show_frame =
      !(gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
        gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE);
}